

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::HttpSocket::_FinishRequest(HttpSocket *this)

{
  bool bVar1;
  int in_ESI;
  HttpSocket *this_local;
  
  if ((this->_inProgress & 1U) != 0) {
    bVar1 = IsRedirecting(this);
    if ((!bVar1) || ((this->_alwaysHandle & 1U) != 0)) {
      (*(this->super_TcpSocket)._vptr_TcpSocket[9])();
    }
    this->_inProgress = false;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->_hdrs);
    if ((this->_mustClose & 1U) != 0) {
      TcpSocket::close(&this->super_TcpSocket,in_ESI);
    }
  }
  return;
}

Assistant:

void HttpSocket::_FinishRequest(void)
{
    traceprint("HttpSocket::_FinishRequest\n");
    if(_inProgress)
    {
        traceprint("... in progress. redirecting = %d\n", IsRedirecting());
        if(!IsRedirecting() || _alwaysHandle)
            _OnRequestDone(); // notify about finished request
        _inProgress = false;
        _hdrs.clear();
        if(_mustClose)
            close();
    }
}